

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O0

void opj_destroy_compress(opj_cinfo_t *cinfo)

{
  opj_j2k_t *j2k;
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    j2k = (opj_j2k_t *)(ulong)(*(int *)((long)in_RDI + 0x14) + 1);
    switch(j2k) {
    case (opj_j2k_t *)0x0:
    case (opj_j2k_t *)0x2:
      break;
    case (opj_j2k_t *)0x1:
      j2k_destroy_compress(j2k);
      break;
    case (opj_j2k_t *)0x3:
      jp2_destroy_compress((opj_jp2_t *)0x2a8bea);
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void OPJ_CALLCONV opj_destroy_compress(opj_cinfo_t *cinfo) {
	if(cinfo) {
		/* destroy the codec */
		switch(cinfo->codec_format) {
			case CODEC_J2K:
				j2k_destroy_compress((opj_j2k_t*)cinfo->j2k_handle);
				break;
			case CODEC_JP2:
				jp2_destroy_compress((opj_jp2_t*)cinfo->jp2_handle);
				break;
			case CODEC_JPT:
			case CODEC_UNKNOWN:
			default:
				break;
		}
		/* destroy the decompressor */
		opj_free(cinfo);
	}
}